

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.cc
# Opt level: O0

void load_GL_INTEL_performance_query(GLADloadproc load)

{
  code *in_RDI;
  
  if (GLAD_GL_INTEL_performance_query != 0) {
    glad_glBeginPerfQueryINTEL = (PFNGLBEGINPERFQUERYINTELPROC)(*in_RDI)("glBeginPerfQueryINTEL");
    glad_glCreatePerfQueryINTEL = (PFNGLCREATEPERFQUERYINTELPROC)(*in_RDI)("glCreatePerfQueryINTEL")
    ;
    glad_glDeletePerfQueryINTEL = (PFNGLDELETEPERFQUERYINTELPROC)(*in_RDI)("glDeletePerfQueryINTEL")
    ;
    glad_glEndPerfQueryINTEL = (PFNGLENDPERFQUERYINTELPROC)(*in_RDI)("glEndPerfQueryINTEL");
    glad_glGetFirstPerfQueryIdINTEL =
         (PFNGLGETFIRSTPERFQUERYIDINTELPROC)(*in_RDI)("glGetFirstPerfQueryIdINTEL");
    glad_glGetNextPerfQueryIdINTEL =
         (PFNGLGETNEXTPERFQUERYIDINTELPROC)(*in_RDI)("glGetNextPerfQueryIdINTEL");
    glad_glGetPerfCounterInfoINTEL =
         (PFNGLGETPERFCOUNTERINFOINTELPROC)(*in_RDI)("glGetPerfCounterInfoINTEL");
    glad_glGetPerfQueryDataINTEL =
         (PFNGLGETPERFQUERYDATAINTELPROC)(*in_RDI)("glGetPerfQueryDataINTEL");
    glad_glGetPerfQueryIdByNameINTEL =
         (PFNGLGETPERFQUERYIDBYNAMEINTELPROC)(*in_RDI)("glGetPerfQueryIdByNameINTEL");
    glad_glGetPerfQueryInfoINTEL =
         (PFNGLGETPERFQUERYINFOINTELPROC)(*in_RDI)("glGetPerfQueryInfoINTEL");
  }
  return;
}

Assistant:

static void load_GL_INTEL_performance_query(GLADloadproc load) {
	if(!GLAD_GL_INTEL_performance_query) return;
	glad_glBeginPerfQueryINTEL = (PFNGLBEGINPERFQUERYINTELPROC)load("glBeginPerfQueryINTEL");
	glad_glCreatePerfQueryINTEL = (PFNGLCREATEPERFQUERYINTELPROC)load("glCreatePerfQueryINTEL");
	glad_glDeletePerfQueryINTEL = (PFNGLDELETEPERFQUERYINTELPROC)load("glDeletePerfQueryINTEL");
	glad_glEndPerfQueryINTEL = (PFNGLENDPERFQUERYINTELPROC)load("glEndPerfQueryINTEL");
	glad_glGetFirstPerfQueryIdINTEL = (PFNGLGETFIRSTPERFQUERYIDINTELPROC)load("glGetFirstPerfQueryIdINTEL");
	glad_glGetNextPerfQueryIdINTEL = (PFNGLGETNEXTPERFQUERYIDINTELPROC)load("glGetNextPerfQueryIdINTEL");
	glad_glGetPerfCounterInfoINTEL = (PFNGLGETPERFCOUNTERINFOINTELPROC)load("glGetPerfCounterInfoINTEL");
	glad_glGetPerfQueryDataINTEL = (PFNGLGETPERFQUERYDATAINTELPROC)load("glGetPerfQueryDataINTEL");
	glad_glGetPerfQueryIdByNameINTEL = (PFNGLGETPERFQUERYIDBYNAMEINTELPROC)load("glGetPerfQueryIdByNameINTEL");
	glad_glGetPerfQueryInfoINTEL = (PFNGLGETPERFQUERYINFOINTELPROC)load("glGetPerfQueryInfoINTEL");
}